

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageinfo.cxx
# Opt level: O3

string * vigra::detail::trimString(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  uVar3 = s->_M_string_length;
  if (uVar3 == 0) {
    uVar4 = 0;
  }
  else {
    uVar2 = 1;
    uVar4 = 0;
    do {
      if ((pcVar1[uVar4] != ' ') && (pcVar1[uVar4] != '\t')) break;
      uVar4 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar4 < uVar3);
    do {
      if ((pcVar1[uVar3 - 1] != ' ') && (pcVar1[uVar3 - 1] != '\t')) goto LAB_0012e947;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  uVar3 = 0;
LAB_0012e947:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,pcVar1 + uVar4,pcVar1 + uVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string trimString(const std::string &s)
{
    unsigned int begin = 0;
    while(begin < s.size() && ((s[begin] == ' ') || (s[begin] == '\t')))
        ++begin;
    std::size_t end = s.size();
    while(end > 0 && ((s[end-1] == ' ') || (s[end-1] == '\t')))
        --end;
    return std::string(s.begin() + begin, s.begin() + end);
}